

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall
FIX::DataDictionary::checkGroupCount
          (DataDictionary *this,FieldBase *field,FieldMap *fieldMap,MsgType *msgType)

{
  int field_00;
  bool bVar1;
  signed_int sVar2;
  size_t sVar3;
  RepeatingGroupCountMismatch *this_00;
  string local_48;
  
  field_00 = field->m_tag;
  bVar1 = isGroup(this,&(msgType->super_StringField).super_FieldBase.m_string,field_00);
  if (bVar1) {
    sVar3 = FieldMap::groupCount(fieldMap,field_00);
    sVar2 = IntConvertor::convert(&field->m_string);
    if (sVar2 != (int)sVar3) {
      this_00 = (RepeatingGroupCountMismatch *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      RepeatingGroupCountMismatch::RepeatingGroupCountMismatch(this_00,field_00,&local_48);
      __cxa_throw(this_00,&RepeatingGroupCountMismatch::typeinfo,FIX::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void checkGroupCount
  ( const FieldBase& field, const FieldMap& fieldMap, const MsgType& msgType ) const
  EXCEPT ( RepeatingGroupCountMismatch )
  {
    int fieldNum = field.getTag();
    if( isGroup(msgType, fieldNum) )
    {
      if( (int)fieldMap.groupCount(fieldNum)
        != IntConvertor::convert(field.getString()) )
      throw RepeatingGroupCountMismatch(fieldNum);
    }
  }